

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O1

int FeederBigSegment(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  FILE *__stream;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  char *__s;
  ulong uVar8;
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    __s = "can\'t create in.txt. No space on disk?";
LAB_00102763:
    puts(__s);
    iVar7 = -1;
  }
  else {
    printf("Creating big segment... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",100000);
    uVar8 = 99999;
    do {
      iVar7 = (int)uVar8;
      uVar6 = 0;
      if (bigSegmentsN != 2) {
        uVar6 = uVar8;
      }
      uVar5 = 0;
      if (bigSegmentsN != 1) {
        uVar5 = uVar8;
      }
      iVar2 = fprintf(__stream,"%d %d\n",uVar6,uVar5);
      if (iVar2 < 2) {
        fclose(__stream);
        __s = "can\'t create in.txt. No space on disk?\n";
        goto LAB_00102763;
      }
      uVar8 = (ulong)(iVar7 - 1);
    } while (iVar7 != 0);
    DVar3 = GetTickCount();
    uVar4 = RoundUptoThousand(DVar3 - DVar1);
    iVar7 = 0;
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ",(ulong)uVar4 / 1000);
    LabTimeout = uVar4 * 2 + 2000;
    LabMemoryLimit = 1;
    fflush(_stdout);
    fclose(__stream);
  }
  return iVar7;
}

Assistant:

static int FeederBigSegment(void)
{
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    printf("Creating big segment... ");
    fflush(stdout);
    DWORD t = GetTickCount();
    fprintf(in, "%d\n", MAX_POINT_COUNT);

    for (int i = MAX_POINT_COUNT - 1; i >= 0; --i) {
        int x = 0;
        int y = 0;

        if (bigSegmentsN != 2) {
            x = i;
        }
        if (bigSegmentsN != 1) {
            y = i;
        }
        
        if (fprintf(in, "%d %d\n", x, y) < 2) {
                fclose(in);
                printf("%s\n", "can't create in.txt. No space on disk?\n");
                return -1;
            }
    }

    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+2000;
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES + 3*sizeof(TPoint)*MAX_POINT_COUNT;
    fflush(stdout);
    fclose(in);

    return 0;    
}